

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::internal::DecodeNetDiagData
                  (Error *__return_storage_ptr__,NetDiagData *aNetDiagData,ByteArray *aPayload)

{
  string *this;
  ErrorCode EVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  mapped_type *pmVar4;
  ByteArray *pBVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  TlvSet tlvSet;
  TlvList tlvList;
  NetDiagData diagData;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char local_190 [16];
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  NetDiagData *local_148;
  _List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_> local_140;
  NetDiagData local_128;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_150 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_150;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_180._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180._M_impl.super__Rb_tree_header._M_header;
  local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_140;
  local_140._M_impl._M_node._M_size = 0;
  local_128.mMode.mIsRxOnWhenIdleMode = false;
  local_128.mMode.mIsMtd = false;
  local_128.mMode.mIsStableNetworkDataRequired = false;
  local_128.mRoute64.mIdSequence = '\0';
  local_128.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mMacAddr = 0;
  local_128.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mLeaderData.mPartitionId = 0;
  local_128.mLeaderData.mWeighting = '\0';
  local_128.mLeaderData.mDataVersion = '\0';
  local_128.mLeaderData.mStableDataVersion = '\0';
  local_128.mLeaderData.mRouterId = '\0';
  local_128.mMacCounters.mIfInUnknownProtos = 0;
  local_128.mMacCounters.mIfInErrors = 0;
  local_128.mMacCounters.mIfOutErrors = 0;
  local_128.mMacCounters.mIfInUcastPkts = 0;
  local_128.mMacCounters.mIfInBroadcastPkts = 0;
  local_128.mMacCounters.mIfInDiscards = 0;
  local_128.mMacCounters.mIfOutUcastPkts = 0;
  local_128.mMacCounters.mIfOutBroadcastPkts = 0;
  local_128.mMacCounters.mIfOutDiscards = 0;
  local_128.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.mPresentFlags = 0;
  local_180._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140._M_impl._M_node.super__List_node_base._M_prev =
       local_140._M_impl._M_node.super__List_node_base._M_next;
  tlv::GetTlvSet((Error *)local_1a8,(TlvSet *)&local_180,aPayload,kNetworkDiag);
  __return_storage_ptr__->mCode = local_1a8._0_4_;
  local_148 = aNetDiagData;
  std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p);
  }
  if (EVar1 == kNone) {
    local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_180,local_1a8);
    pTVar2 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar5 = tlv::Tlv::GetValue(pTVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_128.mExtMacAddr,pBVar5);
      local_128.mPresentFlags = local_128.mPresentFlags | 1;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_1a8[0] = 1;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_180,local_1a8);
    pTVar2 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar5 = tlv::Tlv::GetValue(pTVar2);
      local_128.mMacAddr = utils::Decode<unsigned_short>(pBVar5);
      local_128.mPresentFlags = local_128.mPresentFlags | 2;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_1a8[0] = 2;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_180,local_1a8);
    pTVar2 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    bVar7 = true;
    if (pTVar2 != (Tlv *)0x0) {
      pBVar5 = tlv::Tlv::GetValue(pTVar2);
      DecodeModeData((Error *)local_1a8,&local_128.mMode,pBVar5);
      __return_storage_ptr__->mCode = local_1a8._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
      EVar1 = __return_storage_ptr__->mCode;
      if (local_1a0._M_p != local_190) {
        operator_delete(local_1a0._M_p);
      }
      bVar7 = EVar1 == kNone;
      if (bVar7) {
        local_128.mPresentFlags = local_128.mPresentFlags | 4;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (bVar7) {
      local_1a8[0] = 5;
      pmVar4 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_180,local_1a8);
      pTVar2 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      bVar7 = true;
      if (pTVar2 != (Tlv *)0x0) {
        pBVar5 = tlv::Tlv::GetValue(pTVar2);
        DecodeRoute64((Error *)local_1a8,&local_128.mRoute64,pBVar5);
        __return_storage_ptr__->mCode = local_1a8._0_4_;
        std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
        EVar1 = __return_storage_ptr__->mCode;
        if (local_1a0._M_p != local_190) {
          operator_delete(local_1a0._M_p);
        }
        bVar7 = EVar1 == kNone;
        if (bVar7) {
          local_128.mPresentFlags = local_128.mPresentFlags | 8;
        }
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (bVar7) {
        local_1a8[0] = 6;
        pmVar4 = std::
                 map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                 ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                               *)&local_180,local_1a8);
        pTVar2 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var3 = (pmVar4->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        bVar7 = true;
        if (pTVar2 != (Tlv *)0x0) {
          pBVar5 = tlv::Tlv::GetValue(pTVar2);
          DecodeLeaderData((Error *)local_1a8,&local_128.mLeaderData,pBVar5);
          __return_storage_ptr__->mCode = local_1a8._0_4_;
          std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
          EVar1 = __return_storage_ptr__->mCode;
          if (local_1a0._M_p != local_190) {
            operator_delete(local_1a0._M_p);
          }
          bVar7 = EVar1 == kNone;
          if (bVar7) {
            local_128.mPresentFlags = local_128.mPresentFlags | 0x10;
          }
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (bVar7) {
          local_1a8[0] = 8;
          pmVar4 = std::
                   map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                   ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                 *)&local_180,local_1a8);
          pTVar2 = (pmVar4->
                   super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          p_Var3 = (pmVar4->
                   super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          bVar7 = true;
          if (pTVar2 != (Tlv *)0x0) {
            pBVar5 = tlv::Tlv::GetValue(pTVar2);
            DecodeIpv6AddressList((Error *)local_1a8,&local_128.mAddrs,pBVar5);
            __return_storage_ptr__->mCode = local_1a8._0_4_;
            std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
            EVar1 = __return_storage_ptr__->mCode;
            if (local_1a0._M_p != local_190) {
              operator_delete(local_1a0._M_p);
            }
            bVar7 = EVar1 == kNone;
            if (bVar7) {
              local_128.mPresentFlags = local_128.mPresentFlags | 0x20;
            }
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (bVar7) {
            local_1a8[0] = 9;
            pmVar4 = std::
                     map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                     ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                   *)&local_180,local_1a8);
            pTVar2 = (pmVar4->
                     super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            p_Var3 = (pmVar4->
                     super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            bVar7 = true;
            if (pTVar2 != (Tlv *)0x0) {
              pBVar5 = tlv::Tlv::GetValue(pTVar2);
              DecodeMacCounters((Error *)local_1a8,&local_128.mMacCounters,pBVar5);
              __return_storage_ptr__->mCode = local_1a8._0_4_;
              std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
              EVar1 = __return_storage_ptr__->mCode;
              if (local_1a0._M_p != local_190) {
                operator_delete(local_1a0._M_p);
              }
              bVar7 = EVar1 == kNone;
              if (bVar7) {
                local_128.mPresentFlags = local_128.mPresentFlags | 0x100;
              }
            }
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (bVar7) {
              local_1a8[0] = 0x10;
              pmVar4 = std::
                       map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                       ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                     *)&local_180,local_1a8);
              pTVar2 = (pmVar4->
                       super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              p_Var3 = (pmVar4->
                       super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                }
              }
              bVar7 = true;
              if (pTVar2 != (Tlv *)0x0) {
                pBVar5 = tlv::Tlv::GetValue(pTVar2);
                DecodeChildTable((Error *)local_1a8,&local_128.mChildTable,pBVar5);
                __return_storage_ptr__->mCode = local_1a8._0_4_;
                std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
                EVar1 = __return_storage_ptr__->mCode;
                if (local_1a0._M_p != local_190) {
                  operator_delete(local_1a0._M_p);
                }
                bVar7 = EVar1 == kNone;
                if (bVar7) {
                  local_128.mPresentFlags = local_128.mPresentFlags | 0x40;
                }
              }
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if (bVar7) {
                local_1a8[0] = 0x17;
                pmVar4 = std::
                         map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                       *)&local_180,local_1a8);
                pTVar2 = (pmVar4->
                         super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                p_Var3 = (pmVar4->
                         super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_refcount._M_pi;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  }
                }
                if (pTVar2 != (Tlv *)0x0) {
                  pBVar5 = tlv::Tlv::GetValue(pTVar2);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                            (&local_128.mEui64,pBVar5);
                  local_128.mPresentFlags = local_128.mPresentFlags | 0x80;
                }
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                tlv::GetTlvListByType
                          ((Error *)local_1a8,(TlvList *)&local_140,aPayload,
                           kNetworkDiagChildIpv6Address,kNetworkDiag);
                __return_storage_ptr__->mCode = local_1a8._0_4_;
                std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
                EVar1 = __return_storage_ptr__->mCode;
                if (local_1a0._M_p != local_190) {
                  operator_delete(local_1a0._M_p);
                }
                if (EVar1 == kNone) {
                  if (local_140._M_impl._M_node._M_size == 0) {
LAB_001bded6:
                    NetDiagData::operator=(local_148,&local_128);
                  }
                  else {
                    p_Var6 = (_List_node_base *)&local_140;
                    do {
                      p_Var6 = (((_List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base.
                               _M_next;
                      if (p_Var6 == (_List_node_base *)&local_140) {
                        local_128.mPresentFlags = local_128.mPresentFlags | 0x200;
                        goto LAB_001bded6;
                      }
                      pBVar5 = tlv::Tlv::GetValue((Tlv *)(p_Var6 + 1));
                      DecodeChildIpv6AddressList
                                ((Error *)local_1a8,&local_128.mChildIpv6AddrsInfoList,pBVar5);
                      __return_storage_ptr__->mCode = local_1a8._0_4_;
                      std::__cxx11::string::operator=((string *)this,(string *)&local_1a0);
                      EVar1 = __return_storage_ptr__->mCode;
                      if (local_1a0._M_p != local_190) {
                        operator_delete(local_1a0._M_p);
                      }
                    } while (EVar1 == kNone);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ::~vector(&local_128.mChildIpv6AddrsInfoList);
  if (local_128.mChildTable.
      super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.mChildTable.
                    super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.mAddrs);
  if (local_128.mRoute64.mRouteData.
      super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.mRoute64.mRouteData.
                    super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.mRoute64.mMask.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.mExtMacAddr.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.mEui64.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::_List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
  ::_M_clear(&local_140);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_180);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeNetDiagData(NetDiagData &aNetDiagData, const ByteArray &aPayload)
{
    Error        error;
    tlv::TlvSet  tlvSet;
    tlv::TlvList tlvList;
    NetDiagData  diagData;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload, tlv::Scope::kNetworkDiag));

    if (auto extMacAddr = tlvSet[tlv::Type::kNetworkDiagExtMacAddress])
    {
        const ByteArray &value = extMacAddr->GetValue();
        diagData.mExtMacAddr   = value;
        diagData.mPresentFlags |= NetDiagData::kExtMacAddrBit;
    }

    if (auto macAddr = tlvSet[tlv::Type::kNetworkDiagMacAddress])
    {
        uint16_t value;
        value             = utils::Decode<uint16_t>(macAddr->GetValue());
        diagData.mMacAddr = value;
        diagData.mPresentFlags |= NetDiagData::kMacAddrBit;
    }

    if (auto mode = tlvSet[tlv::Type::kNetworkDiagMode])
    {
        SuccessOrExit(error = internal::DecodeModeData(diagData.mMode, mode->GetValue()));
        diagData.mPresentFlags |= NetDiagData::kModeBit;
    }

    if (auto route64 = tlvSet[tlv::Type::kNetworkDiagRoute64])
    {
        const ByteArray &value = route64->GetValue();
        SuccessOrExit(error = DecodeRoute64(diagData.mRoute64, value));
        diagData.mPresentFlags |= NetDiagData::kRoute64Bit;
    }

    if (auto leaderData = tlvSet[tlv::Type::kNetworkDiagLeaderData])
    {
        const ByteArray &value = leaderData->GetValue();
        SuccessOrExit(error = DecodeLeaderData(diagData.mLeaderData, value));
        diagData.mPresentFlags |= NetDiagData::kLeaderDataBit;
    }

    if (auto ipv6Addrs = tlvSet[tlv::Type::kNetworkDiagIpv6Address])
    {
        const ByteArray &value = ipv6Addrs->GetValue();
        SuccessOrExit(error = DecodeIpv6AddressList(diagData.mAddrs, value));
        diagData.mPresentFlags |= NetDiagData::kAddrsBit;
    }

    if (auto macCounters = tlvSet[tlv::Type::kNetworkDiagMacCounters])
    {
        const ByteArray &value = macCounters->GetValue();
        SuccessOrExit(error = DecodeMacCounters(diagData.mMacCounters, value));
        diagData.mPresentFlags |= NetDiagData::kMacCountersBit;
    }

    if (auto childTable = tlvSet[tlv::Type::kNetworkDiagChildTable])
    {
        const ByteArray &value = childTable->GetValue();
        SuccessOrExit(error = DecodeChildTable(diagData.mChildTable, value));
        diagData.mPresentFlags |= NetDiagData::kChildTableBit;
    }

    if (auto eui64 = tlvSet[tlv::Type::kNetworkDiagEui64])
    {
        const ByteArray &value = eui64->GetValue();
        diagData.mEui64        = value;
        diagData.mPresentFlags |= NetDiagData::kEui64Bit;
    }

    SuccessOrExit(error = tlv::GetTlvListByType(tlvList, aPayload, tlv::Type::kNetworkDiagChildIpv6Address,
                                                tlv::Scope::kNetworkDiag));

    if (tlvList.size() > 0)
    {
        for (const auto &tlv : tlvList)
        {
            SuccessOrExit(error = DecodeChildIpv6AddressList(diagData.mChildIpv6AddrsInfoList, tlv.GetValue()));
        }
        diagData.mPresentFlags |= NetDiagData::kChildIpv6AddrsInfoListBit;
    }

    aNetDiagData = diagData;

exit:
    return error;
}